

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FinishTrigger(Parse *pParse,TriggerStep *pStepList,Token *pAll)

{
  TriggerStep **ppTVar1;
  sqlite3 *db_00;
  Schema *pSVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  TriggerStep *pTVar5;
  size_t sVar6;
  Trigger *pTrigger;
  Vdbe *p;
  void *pvVar7;
  HashElem *pHVar8;
  char *pcVar9;
  Schema **ppSVar10;
  sqlite3 *db;
  Upsert *pUVar11;
  int iDb;
  Trigger *data;
  ulong __n;
  Token nameToken;
  DbFixer sFix;
  char *local_128;
  uint local_120;
  Select local_118;
  Parse *local_90;
  Walker local_88;
  Schema *local_58;
  undefined1 local_50;
  char *local_48;
  char *local_40;
  char **local_38;
  
  db_00 = pParse->db;
  pTrigger = pParse->pNewTrigger;
  pParse->pNewTrigger = (Trigger *)0x0;
  if (pTrigger == (Trigger *)0x0 || pParse->nErr != 0) goto LAB_00181e18;
  if (pTrigger->pSchema == (Schema *)0x0) {
    iDb = -0x8000;
  }
  else {
    iDb = -1;
    ppSVar10 = &db_00->aDb->pSchema;
    do {
      iDb = iDb + 1;
      pSVar2 = *ppSVar10;
      ppSVar10 = ppSVar10 + 4;
    } while (pSVar2 != pTrigger->pSchema);
  }
  __s = pTrigger->zName;
  pTrigger->step_list = pStepList;
  pTVar5 = pStepList;
  if (pStepList != (TriggerStep *)0x0) {
    do {
      pTVar5->pTrig = pTrigger;
      ppTVar1 = &pTVar5->pNext;
      pTVar5 = *ppTVar1;
    } while (*ppTVar1 != (TriggerStep *)0x0);
  }
  local_128 = __s;
  if (__s == (char *)0x0) {
    local_120 = 0;
  }
  else {
    sVar6 = strlen(__s);
    local_120 = (uint)sVar6 & 0x3fffffff;
  }
  local_38 = &local_128;
  local_48 = db_00->aDb[iDb].zDbSName;
  local_58 = db_00->aDb[iDb].pSchema;
  local_50 = iDb == 1;
  local_40 = "trigger";
  local_88.xExprCallback = fixExprCb;
  local_88.xSelectCallback = fixSelectCb;
  local_88.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
  local_88.walkerDepth = 0;
  local_88.eCode = 0;
  local_88.u.pNC = (NameContext *)&local_90;
  local_90 = pParse;
  local_88.pParse = pParse;
  if (pStepList != (TriggerStep *)0x0) {
    do {
      iVar4 = sqlite3WalkSelect(&local_88,pStepList->pSelect);
      if ((iVar4 != 0) ||
         (((pStepList->pWhere != (Expr *)0x0 &&
           (iVar4 = walkExpr(&local_88,pStepList->pWhere), iVar4 != 0)) ||
          (iVar4 = sqlite3WalkExprList(&local_88,pStepList->pExprList), iVar4 != 0))))
      goto LAB_00181e15;
      if (pStepList->pFrom != (SrcList *)0x0) {
        local_118.pEList = (ExprList *)0x0;
        local_118.pWin = (Window *)0x0;
        local_118.pWinDefn = (Window *)0x0;
        local_118.pLimit = (Expr *)0x0;
        local_118.pWith = (With *)0x0;
        local_118.pPrior = (Select *)0x0;
        local_118.pNext = (Select *)0x0;
        local_118.pHaving = (Expr *)0x0;
        local_118.pOrderBy = (ExprList *)0x0;
        local_118.pWhere = (Expr *)0x0;
        local_118.pGroupBy = (ExprList *)0x0;
        local_118.selId = 0;
        local_118.addrOpenEphm[0] = 0;
        local_118.addrOpenEphm[1] = 0;
        local_118._28_4_ = 0;
        local_118.op = '\0';
        local_118._1_1_ = 0;
        local_118.nSelectRow = 0;
        local_118.selFlags = 0;
        local_118.iLimit = 0;
        local_118.iOffset = 0;
        local_118.pSrc = pStepList->pFrom;
        iVar4 = sqlite3WalkSelect(&local_88,&local_118);
        if (iVar4 != 0) goto LAB_00181e15;
      }
      for (pUVar11 = pStepList->pUpsert; pUVar11 != (Upsert *)0x0; pUVar11 = pUVar11->pNextUpsert) {
        iVar4 = sqlite3WalkExprList(&local_88,pUVar11->pUpsertTarget);
        if ((((iVar4 != 0) ||
             ((pUVar11->pUpsertTargetWhere != (Expr *)0x0 &&
              (iVar4 = walkExpr(&local_88,pUVar11->pUpsertTargetWhere), iVar4 != 0)))) ||
            (iVar4 = sqlite3WalkExprList(&local_88,pUVar11->pUpsertSet), iVar4 != 0)) ||
           ((pUVar11->pUpsertWhere != (Expr *)0x0 &&
            (iVar4 = walkExpr(&local_88,pUVar11->pUpsertWhere), iVar4 != 0)))) {
          pStepList = (TriggerStep *)0x0;
          goto LAB_00181e18;
        }
      }
      pStepList = pStepList->pNext;
    } while (pStepList != (TriggerStep *)0x0);
  }
  if ((pTrigger->pWhen == (Expr *)0x0) || (iVar4 = walkExpr(&local_88,pTrigger->pWhen), iVar4 == 0))
  {
    if (pParse->eParseMode < 2) {
      data = pTrigger;
      if ((db_00->init).busy == '\0') {
        if (((((db_00->flags & 0x10000000) == 0) || (db_00->pVtabCtx != (VtabCtx *)0x0)) ||
            (db_00->nVdbeExec != 0)) || ((0 < db_00->nVTrans && (db_00->aVTrans == (VTable **)0x0)))
           ) {
LAB_00181ce5:
          p = sqlite3GetVdbe(pParse);
          if (p == (Vdbe *)0x0) {
            bVar3 = true;
          }
          else {
            pvVar7 = (void *)0x0;
            sqlite3BeginWriteOperation(pParse,0,iDb);
            pcVar9 = pAll->z;
            __n = (ulong)pAll->n;
            if (pcVar9 != (char *)0x0) {
              pvVar7 = sqlite3DbMallocRawNN(db_00,__n + 1);
            }
            if (pvVar7 == (void *)0x0) {
              sqlite3NestedParse(pParse,
                                 "INSERT INTO %Q.sqlite_master VALUES(\'trigger\',%Q,%Q,0,\'CREATE TRIGGER %q\')"
                                 ,db_00->aDb[iDb].zDbSName,__s,pTrigger->table,0);
            }
            else {
              memcpy(pvVar7,pcVar9,__n);
              *(undefined1 *)((long)pvVar7 + __n) = 0;
              sqlite3NestedParse(pParse,
                                 "INSERT INTO %Q.sqlite_master VALUES(\'trigger\',%Q,%Q,0,\'CREATE TRIGGER %q\')"
                                 ,db_00->aDb[iDb].zDbSName,__s,pTrigger->table,pvVar7);
              sqlite3DbFreeNN(db_00,pvVar7);
            }
            sqlite3ChangeCookie(pParse,iDb);
            bVar3 = false;
            pcVar9 = sqlite3MPrintf(db_00,"type=\'trigger\' AND name=\'%q\'",__s);
            sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar9,0);
          }
        }
        else {
          for (pTVar5 = pTrigger->step_list; pTVar5 != (TriggerStep *)0x0; pTVar5 = pTVar5->pNext) {
            if ((pTVar5->zTarget != (char *)0x0) &&
               (iVar4 = sqlite3ShadowTableName(db_00,pTVar5->zTarget), iVar4 != 0)) {
              sqlite3ErrorMsg(pParse,"trigger \"%s\" may not write to shadow table \"%s\"",
                              pTrigger->zName,pTVar5->zTarget);
              bVar3 = true;
              goto LAB_00181ea2;
            }
          }
          bVar3 = false;
LAB_00181ea2:
          if (pTVar5 == (TriggerStep *)0x0) goto LAB_00181ce5;
        }
        if (bVar3) goto LAB_00181e15;
      }
    }
    else {
      pParse->pNewTrigger = pTrigger;
      data = (Trigger *)0x0;
    }
    pTrigger = data;
    if ((db_00->init).busy != '\0') {
      pTrigger = (Trigger *)sqlite3HashInsert(&(db_00->aDb[iDb].pSchema)->trigHash,__s,data);
      if (pTrigger == (Trigger *)0x0) {
        if (data->pSchema == data->pTabSchema) {
          pHVar8 = findElementWithHash(&data->pTabSchema->tblHash,data->table,(uint *)0x0);
          pvVar7 = pHVar8->data;
          data->pNext = *(Trigger **)((long)pvVar7 + 0x58);
          *(Trigger **)((long)pvVar7 + 0x58) = data;
        }
      }
      else {
        sqlite3OomFault(db_00);
      }
      pStepList = (TriggerStep *)0x0;
      goto LAB_00181e18;
    }
  }
LAB_00181e15:
  pStepList = (TriggerStep *)0x0;
LAB_00181e18:
  sqlite3DeleteTrigger(db_00,pTrigger);
  sqlite3DeleteTriggerStep(db_00,pStepList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishTrigger(
  Parse *pParse,          /* Parser context */
  TriggerStep *pStepList, /* The triggered program */
  Token *pAll             /* Token that describes the complete CREATE TRIGGER */
){
  Trigger *pTrig = pParse->pNewTrigger;   /* Trigger being finished */
  char *zName;                            /* Name of trigger */
  sqlite3 *db = pParse->db;               /* The database */
  DbFixer sFix;                           /* Fixer object */
  int iDb;                                /* Database containing the trigger */
  Token nameToken;                        /* Trigger name for error reporting */

  pParse->pNewTrigger = 0;
  if( NEVER(pParse->nErr) || !pTrig ) goto triggerfinish_cleanup;
  zName = pTrig->zName;
  iDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
  pTrig->step_list = pStepList;
  while( pStepList ){
    pStepList->pTrig = pTrig;
    pStepList = pStepList->pNext;
  }
  sqlite3TokenInit(&nameToken, pTrig->zName);
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", &nameToken);
  if( sqlite3FixTriggerStep(&sFix, pTrig->step_list)
   || sqlite3FixExpr(&sFix, pTrig->pWhen)
  ){
    goto triggerfinish_cleanup;
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( IN_RENAME_OBJECT ){
    assert( !db->init.busy );
    pParse->pNewTrigger = pTrig;
    pTrig = 0;
  }else
#endif

  /* if we are not initializing,
  ** build the sqlite_schema entry
  */
  if( !db->init.busy ){
    Vdbe *v;
    char *z;

    /* If this is a new CREATE TABLE statement, and if shadow tables
    ** are read-only, and the trigger makes a change to a shadow table,
    ** then raise an error - do not allow the trigger to be created. */
    if( sqlite3ReadOnlyShadowTables(db) ){
      TriggerStep *pStep;
      for(pStep=pTrig->step_list; pStep; pStep=pStep->pNext){
        if( pStep->zTarget!=0
         && sqlite3ShadowTableName(db, pStep->zTarget)
        ){
          sqlite3ErrorMsg(pParse,
            "trigger \"%s\" may not write to shadow table \"%s\"",
            pTrig->zName, pStep->zTarget);
          goto triggerfinish_cleanup;
        }
      }
    }

    /* Make an entry in the sqlite_schema table */
    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto triggerfinish_cleanup;
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    z = sqlite3DbStrNDup(db, (char*)pAll->z, pAll->n);
    testcase( z==0 );
    sqlite3NestedParse(pParse,
       "INSERT INTO %Q." LEGACY_SCHEMA_TABLE
       " VALUES('trigger',%Q,%Q,0,'CREATE TRIGGER %q')",
       db->aDb[iDb].zDbSName, zName,
       pTrig->table, z);
    sqlite3DbFree(db, z);
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddParseSchemaOp(v, iDb,
        sqlite3MPrintf(db, "type='trigger' AND name='%q'", zName), 0);
  }

  if( db->init.busy ){
    Trigger *pLink = pTrig;
    Hash *pHash = &db->aDb[iDb].pSchema->trigHash;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( pLink!=0 );
    pTrig = sqlite3HashInsert(pHash, zName, pTrig);
    if( pTrig ){
      sqlite3OomFault(db);
    }else if( pLink->pSchema==pLink->pTabSchema ){
      Table *pTab;
      pTab = sqlite3HashFind(&pLink->pTabSchema->tblHash, pLink->table);
      assert( pTab!=0 );
      pLink->pNext = pTab->pTrigger;
      pTab->pTrigger = pLink;
    }
  }

triggerfinish_cleanup:
  sqlite3DeleteTrigger(db, pTrig);
  assert( IN_RENAME_OBJECT || !pParse->pNewTrigger );
  sqlite3DeleteTriggerStep(db, pStepList);
}